

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  uint uVar1;
  int *piVar2;
  ulong uVar3;
  char *__format;
  char c;
  int n;
  priority_queue<int,_std::less<int>_> pq;
  byte local_59;
  uint local_58;
  uint local_54;
  priority_queue<int,_std::less<int>_> local_50;
  
  local_50.mData = (int *)operator_new__(4);
  *local_50.mData = 0;
  local_50.mCap = 1;
  local_50.mSize = 0;
LAB_0010127f:
  while( true ) {
    while( true ) {
      __isoc99_scanf("%c",&local_59);
      if (local_59 < 0x66) break;
      if ((local_59 == 0x66) || (local_59 == 0x6c)) goto LAB_001012be;
      if (local_59 == 0x71) {
        if (local_50.mData != (int *)0x0) {
          operator_delete__(local_50.mData);
        }
        return 0;
      }
    }
    if (local_59 == 0x61) break;
    if (local_59 == 100) {
      CP::priority_queue<int,_std::less<int>_>::pop(&local_50);
    }
  }
LAB_001012be:
  __isoc99_scanf("%d",&local_58);
  if (local_59 == 0x6c) {
    uVar1 = CP::priority_queue<int,_std::less<int>_>::find_level(&local_50,local_58);
    uVar3 = (ulong)local_58;
    if (-1 < (int)uVar1) {
      printf("Found %d at level %d\n",uVar3,(ulong)uVar1);
      goto LAB_0010127f;
    }
LAB_00101353:
    __format = "%d not found\n";
  }
  else {
    if (local_59 != 0x66) {
      if (local_59 == 0x61) {
        CP::priority_queue<int,_std::less<int>_>::push(&local_50,(int *)&local_58);
      }
      goto LAB_0010127f;
    }
    local_54 = local_58;
    piVar2 = std::__find_if<int*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                       (local_50.mData,local_50.mData + local_50.mSize,&local_54);
    uVar3 = (ulong)local_58;
    if (piVar2 == local_50.mData + local_50.mSize) goto LAB_00101353;
    __format = "Found %d\n";
  }
  printf(__format,uVar3);
  goto LAB_0010127f;
}

Assistant:

int main() {
  CP::priority_queue<int> pq;
  char c;
  scanf("%c", &c);
  while (c != 'q') {
    if (c == 'a' || c == 'f' || c == 'l') {
      // add data
      int n;
      scanf("%d", &n);
      if (c == 'a') {
        pq.push(n);
      } else if (c == 'f') {
        bool r = pq.find(n);
        if (r) {
          printf("Found %d\n",n);
        } else {
          printf("%d not found\n",n);
        }
      } else if (c == 'l') {
        int r = pq.find_level(n);
        if (r >= 0) {
          printf("Found %d at level %d\n",n,r);
        } else {
          printf("%d not found\n",n);
        }
      }
    } else if (c == 'd') {
       pq.pop();
    }
    scanf("%c", &c);
  }
  return 0;
}